

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t mbsnbytes(void *_p,size_t n)

{
  bool bVar1;
  char *local_38;
  char *pp;
  char *p;
  size_t s;
  size_t n_local;
  void *_p_local;
  
  if (_p == (void *)0x0) {
    _p_local = (void *)0x0;
  }
  else {
    p = (char *)0x0;
    local_38 = (char *)_p;
    while( true ) {
      bVar1 = false;
      if (p < n) {
        bVar1 = *local_38 != '\0';
      }
      if (!bVar1) break;
      local_38 = local_38 + 1;
      p = p + 1;
    }
    _p_local = p;
  }
  return (size_t)_p_local;
}

Assistant:

static size_t
mbsnbytes(const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	if (_p == NULL)
		return (0);
	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	return (s);
}